

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wsi.c
# Opt level: O0

void lws_http_close_immortal(lws *wsi)

{
  lws *wsi_00;
  int local_24;
  lws *nwsi;
  lws *wsi_local;
  
  if ((*(ulong *)&wsi->field_0x2dc >> 1 & 1) != 0) {
    if ((*(ulong *)&wsi->field_0x2dc >> 3 & 1) == 0) {
      __assert_fail("wsi->mux_stream_immortal",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/dmikushin[P]libwebsockets/lib/core-net/wsi.c"
                    ,0x3db,"void lws_http_close_immortal(struct lws *)");
    }
    *(ulong *)&wsi->field_0x2dc = *(ulong *)&wsi->field_0x2dc & 0xfffffffffffffff7;
    wsi_00 = lws_get_network_wsi(wsi);
    _lws_log(0x10,"%s: %p %p %d\n","lws_http_close_immortal",wsi,wsi_00,
             (ulong)wsi_00->immortal_substream_count);
    if (wsi_00->immortal_substream_count == '\0') {
      __assert_fail("nwsi->immortal_substream_count",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/dmikushin[P]libwebsockets/lib/core-net/wsi.c"
                    ,0x3e1,"void lws_http_close_immortal(struct lws *)");
    }
    wsi_00->immortal_substream_count = wsi_00->immortal_substream_count + 0xff;
    if (wsi_00->immortal_substream_count == '\0') {
      if (wsi->vhost->keepalive_timeout == 0) {
        local_24 = 0x1f;
      }
      else {
        local_24 = wsi->vhost->keepalive_timeout;
      }
      lws_set_timeout(wsi_00,PENDING_TIMEOUT_HTTP_KEEPALIVE_IDLE,local_24);
    }
  }
  return;
}

Assistant:

void
lws_http_close_immortal(struct lws *wsi)
{
	struct lws *nwsi;

	if (!wsi->mux_substream)
		return;

	assert(wsi->mux_stream_immortal);
	wsi->mux_stream_immortal = 0;

	nwsi = lws_get_network_wsi(wsi);
	lwsl_debug("%s: %p %p %d\n", __func__, wsi, nwsi,
				     nwsi->immortal_substream_count);
	assert(nwsi->immortal_substream_count);
	nwsi->immortal_substream_count--;
	if (!nwsi->immortal_substream_count)
		/*
		 * since we closed the only immortal stream on this nwsi, we
		 * need to reapply a normal timeout regime to the nwsi
		 */
		lws_set_timeout(nwsi, PENDING_TIMEOUT_HTTP_KEEPALIVE_IDLE,
				wsi->vhost->keepalive_timeout ?
				    wsi->vhost->keepalive_timeout : 31);
}